

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_EndProcessing
                  (PaAlsaStreamComponent *self,unsigned_long numFrames,int *xrun)

{
  snd_pcm_format_t sVar1;
  snd_pcm_t *psVar2;
  snd_pcm_uframes_t sVar3;
  long lVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  undefined1 *in_RAX;
  void *pvVar8;
  PaError PVar9;
  undefined1 **ppuVar10;
  long lVar11;
  undefined8 uStack_40;
  undefined1 *local_38;
  
  ppuVar10 = &local_38;
  local_38 = (undefined1 *)&local_38;
  PVar9 = 0;
  if (self->ready == 0) {
    return 0;
  }
  puVar5 = in_RAX;
  if (self->canMmap == 0) {
    iVar6 = 0;
    ppuVar10 = &local_38;
    puVar5 = in_RAX;
    if (self->streamDir == StreamDirection_Out) {
      if (self->hostInterleaved == 0) {
        lVar4 = -((ulong)(uint)self->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
        sVar1 = self->nativeFormat;
        *(undefined8 *)((long)&uStack_40 + lVar4) = 0x11229c;
        iVar7 = snd_pcm_format_size(sVar1);
        iVar6 = self->numHostChannels;
        if (0 < (long)iVar6) {
          pvVar8 = self->nonMmapBuffer;
          lVar11 = 0;
          do {
            *(void **)((long)&local_38 + lVar4 + lVar11 * 8) = pvVar8;
            pvVar8 = (void *)((long)pvVar8 + (long)iVar7);
            lVar11 = lVar11 + 1;
          } while (iVar6 != lVar11);
        }
        psVar2 = self->pcm;
        *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1122cf;
        iVar6 = snd_pcm_writen(psVar2,(long)&local_38 + lVar4,numFrames);
        ppuVar10 = (undefined1 **)local_38;
        puVar5 = local_38;
      }
      else {
        uStack_40 = 0x11226a;
        local_38 = in_RAX;
        iVar6 = snd_pcm_writei(self->pcm,self->nonMmapBuffer,numFrames);
        ppuVar10 = &local_38;
        puVar5 = local_38;
      }
    }
    local_38 = puVar5;
    puVar5 = local_38;
    if (self->canMmap == 0) goto LAB_001122ed;
  }
  local_38 = puVar5;
  psVar2 = self->pcm;
  sVar3 = self->offset;
  *(undefined8 *)((long)ppuVar10 + -8) = 0x1122ed;
  iVar6 = snd_pcm_mmap_commit(psVar2,sVar3,numFrames);
LAB_001122ed:
  if ((iVar6 == -0x20) || (iVar6 == -0x56)) {
    *xrun = 1;
  }
  else if (iVar6 < 0) {
    *(undefined8 *)((long)ppuVar10 + -8) = 0x11231c;
    PaAlsaStreamComponent_EndProcessing_cold_1();
    PVar9 = -9999;
  }
  return PVar9;
}

Assistant:

static PaError PaAlsaStreamComponent_EndProcessing( PaAlsaStreamComponent *self, unsigned long numFrames, int *xrun )
{
    PaError result = paNoError;
    int res = 0;

    /* @concern FullDuplex It is possible that only one direction is marked ready after polling, and processed
     * afterwards
     */
    if( !self->ready )
        goto end;

    if( !self->canMmap && StreamDirection_Out == self->streamDir )
    {
        /* Play sound */
        if( self->hostInterleaved )
            res = alsa_snd_pcm_writei( self->pcm, self->nonMmapBuffer, numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            int bufsize = alsa_snd_pcm_format_size( self->nativeFormat, self->framesPerPeriod + 1 );
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += bufsize;
            }
            res = alsa_snd_pcm_writen( self->pcm, bufs, numFrames );
        }
    }

    if( self->canMmap )
        res = alsa_snd_pcm_mmap_commit( self->pcm, self->offset, numFrames );

    if( res == -EPIPE || res == -ESTRPIPE )
    {
        *xrun = 1;
    }
    else
    {
        ENSURE_( res, paUnanticipatedHostError );
    }

end:
error:
    return result;
}